

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_udata.c
# Opt level: O2

void * lj_lightud_intern(lua_State *L,void *p)

{
  long lVar1;
  byte bVar2;
  uint64_t uVar3;
  void *p_00;
  uint uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  
  uVar3 = (L->glref).ptr64;
  uVar8 = (uint)((ulong)p >> 0x20) & 0xffffff80;
  p_00 = *(void **)(uVar3 + 0x70);
  bVar2 = *(byte *)(uVar3 + 0x23);
  uVar4 = (uint)bVar2;
  if (p_00 == (void *)0x0) {
LAB_001266f0:
    uVar7 = (ulong)uVar4;
    if (uVar4 != 1 && (uVar4 & uVar4 - 1) == 0) {
      iVar5 = 2;
      if (uVar7 != 0) {
        iVar5 = uVar4 * 2;
      }
      p_00 = lj_mem_realloc(L,p_00,(ulong)(uVar4 * 4),(ulong)(uint)(iVar5 << 2));
      *(void **)(uVar3 + 0x70) = p_00;
    }
    *(char *)(uVar3 + 0x23) = (char)uVar4;
    *(uint *)((long)p_00 + uVar7 * 4) = uVar8;
  }
  else {
    uVar4 = bVar2 + 1;
    uVar6 = 0xffffffffffffffff;
    do {
      if (bVar2 == uVar6) {
        if (0xfd < bVar2) {
          lj_err_msg(L,LJ_ERR_BADLU);
        }
        goto LAB_001266f0;
      }
      uVar7 = uVar6 + 1;
      lVar1 = uVar6 * 4;
      uVar6 = uVar7;
    } while (*(uint *)((long)p_00 + lVar1 + 4) != uVar8);
  }
  return (void *)((ulong)p & 0x7fffffffff | uVar7 << 0x27);
}

Assistant:

void *lj_lightud_intern(lua_State *L, void *p)
{
  global_State *g = G(L);
  uint64_t u = (uint64_t)p;
  uint32_t up = lightudup(u);
  uint32_t *segmap = mref(g->gc.lightudseg, uint32_t);
  MSize segnum = g->gc.lightudnum;
  if (segmap) {
    MSize seg;
    for (seg = 0; seg <= segnum; seg++)
      if (segmap[seg] == up)  /* Fast path. */
	return (void *)(((uint64_t)seg << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
    segnum++;
    /* Leave last segment unused to avoid clash with ITERN key. */
    if (segnum >= (1 << LJ_LIGHTUD_BITS_SEG)-1) lj_err_msg(L, LJ_ERR_BADLU);
  }
  if (!((segnum-1) & segnum) && segnum != 1) {
    lj_mem_reallocvec(L, segmap, segnum, segnum ? 2*segnum : 2u, uint32_t);
    setmref(g->gc.lightudseg, segmap);
  }
  g->gc.lightudnum = segnum;
  segmap[segnum] = up;
  return (void *)(((uint64_t)segnum << LJ_LIGHTUD_BITS_LO) | lightudlo(u));
}